

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O2

float128 propagateFloat128NaN(float128 a,float128 b,float_status *status)

{
  ulong uVar1;
  FloatClass a_cls;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  FloatClass b_cls;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  float128 fVar10;
  
  uVar3 = b.high;
  uVar4 = b.low;
  uVar7 = a.high;
  uVar8 = a.low;
  a_cls = float_class_normal;
  if (((~uVar7 & 0x7fff000000000000) == 0) &&
     (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
      uVar8 != 0)) {
    a_cls = (((undefined1  [16])a & (undefined1  [16])0x7fffffffffff) == (undefined1  [16])0x0 &&
             uVar8 == 0 || (uVar7 & 0x7fff800000000000) != 0x7fff000000000000) ^ float_class_snan;
  }
  if (((~uVar3 & 0x7fff000000000000) == 0) &&
     (((undefined1  [16])b & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
      uVar4 != 0)) {
    bVar6 = (((undefined1  [16])b & (undefined1  [16])0x7fffffffffff) != (undefined1  [16])0x0 ||
            uVar4 != 0) && (uVar3 & 0x7fff800000000000) == 0x7fff000000000000;
    bVar9 = a_cls == float_class_snan;
    b_cls = float_class_snan;
    if (bVar9) {
      b_cls = bVar6 + float_class_qnan;
    }
    if (bVar6 || bVar9) {
LAB_00b1dd30:
      status->float_exception_flags = status->float_exception_flags | 1;
      goto LAB_00b1dd3a;
    }
    b_cls = float_class_qnan;
  }
  else {
    b_cls = float_class_normal;
    bVar9 = true;
    if (a_cls == float_class_snan) goto LAB_00b1dd30;
  }
  bVar9 = false;
LAB_00b1dd3a:
  if (status->default_nan_mode == '\0') {
    uVar5 = uVar7 * 2;
    uVar1 = uVar3 * 2;
    bVar6 = false;
    if ((uVar1 <= uVar5) && (bVar6 = false, uVar4 <= uVar8 || uVar5 != uVar1)) {
      bVar6 = true;
      if ((uVar5 <= uVar1) && (uVar8 <= uVar4 || uVar5 != uVar1)) {
        bVar6 = uVar7 < uVar3;
      }
    }
    iVar2 = pickNaN(a_cls,b_cls,bVar6);
    if (iVar2 == 0) {
      uVar5 = uVar7 | 0x800000000000;
      uVar4 = uVar8;
      if (!bVar9) {
        uVar5 = uVar7;
      }
    }
    else {
      uVar5 = uVar3 | 0x800000000000;
      if (b_cls != float_class_snan) {
        uVar5 = uVar3;
      }
    }
  }
  else {
    uVar5 = 0x7fff800000000000;
    uVar4 = 0;
  }
  fVar10.high = uVar5;
  fVar10.low = uVar4;
  return fVar10;
}

Assistant:

static float128 propagateFloat128NaN(float128 a, float128 b,
                                     float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!float128_is_any_nan(a)
             ? float_class_normal
             : float128_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!float128_is_any_nan(b)
             ? float_class_normal
             : float128_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return float128_default_nan(status);
    }

    if (lt128(a.high << 1, a.low, b.high << 1, b.low)) {
        aIsLargerSignificand = 0;
    } else if (lt128(b.high << 1, b.low, a.high << 1, a.low)) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return float128_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return float128_silence_nan(a, status);
        }
        return a;
    }
}